

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

int OBJ_create(char *oid,char *sn,char *ln)

{
  int iVar1;
  ASN1_OBJECT *obj;
  ASN1_OBJECT *op;
  char *long_name_local;
  char *short_name_local;
  char *oid_local;
  
  obj = create_object_with_text_oid(obj_next_nid,oid,sn,ln);
  if ((obj != (ASN1_OBJECT *)0x0) && (iVar1 = obj_add_object(obj), iVar1 != 0)) {
    return obj->nid;
  }
  return 0;
}

Assistant:

int OBJ_create(const char *oid, const char *short_name, const char *long_name) {
  ASN1_OBJECT *op =
      create_object_with_text_oid(obj_next_nid, oid, short_name, long_name);
  if (op == NULL || !obj_add_object(op)) {
    return NID_undef;
  }
  return op->nid;
}